

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QList<QGestureRecognizer_*> * __thiscall
QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::values
          (QList<QGestureRecognizer_*> *__return_storage_ptr__,
          QMultiMap<Qt::GestureType,_QGestureRecognizer_*> *this,GestureType *key)

{
  difference_type asize;
  pair<QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::const_iterator,_QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::const_iterator>
  pVar1;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGestureRecognizer **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pVar1 = equal_range(this,key);
  asize = std::__distance<QMultiMap<Qt::GestureType,QGestureRecognizer*>::const_iterator>
                    (pVar1.first.i._M_node.i,pVar1.second.i._M_node.i);
  QList<QGestureRecognizer_*>::reserve(__return_storage_ptr__,asize);
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<QMultiMap<Qt::GestureType,QGestureRecognizer*>::const_iterator,std::back_insert_iterator<QList<QGestureRecognizer*>>>
            (pVar1.first.i._M_node,pVar1.second.i._M_node,
             (back_insert_iterator<QList<QGestureRecognizer_*>_>)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

QList<T> values(const Key &key) const
    {
        QList<T> result;
        const auto range = equal_range(key);
        result.reserve(std::distance(range.first, range.second));
        std::copy(range.first, range.second, std::back_inserter(result));
        return result;
    }